

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_type_visitor.cc
# Opt level: O2

void __thiscall iqxmlrpc::Print_value_visitor::do_visit_struct(Print_value_visitor *this,Struct *s)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  
  std::operator<<(this->out_,"{");
  for (p_Var2 = (s->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(s->values)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    poVar1 = std::operator<<(this->out_," \'");
    poVar1 = std::operator<<(poVar1,(string *)(p_Var2 + 1));
    std::operator<<(poVar1,"\' => ");
    Value::apply_visitor(*(Value **)(p_Var2 + 2),&this->super_Value_type_visitor);
    std::operator<<(this->out_,",");
  }
  std::operator<<(this->out_," }");
  return;
}

Assistant:

void Print_value_visitor::do_visit_struct(const Struct& s)
{
  out_ << "{";

  typedef Struct::const_iterator CI;
  for(CI i = s.begin(); i != s.end(); ++i )
  {
    out_ << " '" << i->first << "' => ";
    i->second->apply_visitor(*this);
    out_ << ",";
  }

  out_ << " }";
}